

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::operator==(ModelDescription *a,ModelDescription *b)

{
  bool bVar1;
  Metadata *b_00;
  Metadata *a_00;
  
  bVar1 = operator!=(&a->input_,&b->input_);
  if ((((!bVar1) && (bVar1 = operator!=(&a->output_,&b->output_), !bVar1)) &&
      (bVar1 = std::operator!=((a->predictedfeaturename_).ptr_,(b->predictedfeaturename_).ptr_),
      !bVar1)) &&
     (bVar1 = std::operator!=((a->predictedprobabilitiesname_).ptr_,
                              (b->predictedprobabilitiesname_).ptr_), !bVar1)) {
    a_00 = a->metadata_;
    if (a_00 == (Metadata *)0x0) {
      a_00 = (Metadata *)&_Metadata_default_instance_;
    }
    b_00 = b->metadata_;
    if (b_00 == (Metadata *)0x0) {
      b_00 = (Metadata *)&_Metadata_default_instance_;
    }
    bVar1 = operator!=(a_00,b_00);
    return !bVar1;
  }
  return false;
}

Assistant:

bool operator==(const ModelDescription& a,
                        const ModelDescription& b) {
            if (a.input() != b.input()) {
                return false;
            }
            if (a.output() != b.output()) {
                return false;
            }
            if (a.predictedfeaturename() != b.predictedfeaturename()) {
                return false;
            }
            if (a.predictedprobabilitiesname() != b.predictedprobabilitiesname()) {
                return false;
            }
            if (a.metadata() != b.metadata()) {
                return false;
            }
            return true;
        }